

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void am_execute_script_step_one_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  ostream *poVar4;
  Am_Slot_Key key;
  Am_Object script_window;
  Am_Object local_60;
  Am_Object line;
  Am_Value_List all_cmds;
  Am_Value_List new_value;
  Am_Object script_cmd;
  Am_Value_List sel_cmds;
  Am_Object execute_cmd;
  
  Am_Object::Get_Object((Am_Object *)&sel_cmds,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&script_window,(Am_Slot_Flags)&sel_cmds);
  Am_Object::~Am_Object((Am_Object *)&sel_cmds);
  pAVar2 = Am_Object::Get(&script_window,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&execute_cmd,pAVar2);
  key = (Am_Slot_Key)&script_window;
  Am_Object::Get_Object((Am_Object *)&all_cmds,key,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar2 = Am_Object::Get((Am_Object *)&all_cmds,0x169,0);
  Am_Value_List::Am_Value_List(&sel_cmds,pAVar2);
  Am_Object::~Am_Object((Am_Object *)&all_cmds);
  line.data = (Am_Object_Data *)0x0;
  script_cmd.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Value_List::Valid(&sel_cmds);
  if (bVar1) {
    Am_Value_List::Start(&sel_cmds);
    pAVar2 = Am_Value_List::Get(&sel_cmds);
    Am_Object::operator=(&line,pAVar2);
    pAVar2 = Am_Object::Get(&line,0xc5,0);
    Am_Object::operator=(&script_cmd,pAVar2);
  }
  do_execute_script(&execute_cmd,true,&script_cmd);
  Am_Object::Get_Object((Am_Object *)&new_value,key,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar2 = Am_Object::Get((Am_Object *)&new_value,0xa2,0);
  Am_Value_List::Am_Value_List(&all_cmds,pAVar2);
  Am_Object::~Am_Object((Am_Object *)&new_value);
  Am_Value_List::Start(&all_cmds);
  bVar1 = Am_Object::Valid(&line);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&line);
    bVar1 = Am_Value_List::Member(&all_cmds,pAVar3);
    if (!bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar4 = std::operator<<(poVar4,"Line ");
      poVar4 = operator<<(poVar4,&line);
      poVar4 = std::operator<<(poVar4," lost from ");
      poVar4 = operator<<(poVar4,&script_window);
      std::endl<char,std::char_traits<char>>(poVar4);
      Am_Error();
    }
  }
  Am_Value_List::Next(&all_cmds);
  Am_Value_List::Am_Value_List(&new_value);
  bVar1 = Am_Value_List::Last(&all_cmds);
  if (!bVar1) {
    pAVar2 = Am_Value_List::Get(&all_cmds);
    Am_Value_List::Add(&new_value,pAVar2,Am_TAIL,true);
  }
  if (am_sdebug == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"--One_step; Setting value of ");
    Am_Object::Get_Object(&local_60,key,(ulong)Am_UNDO_SCROLL_GROUP);
    poVar4 = operator<<(poVar4,&local_60);
    poVar4 = std::operator<<(poVar4," to be ");
    poVar4 = operator<<(poVar4,&new_value);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
    Am_Object::~Am_Object(&local_60);
  }
  Am_Object::Get_Object(&local_60,key,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_value);
  Am_Object::Set(&local_60,0x169,pAVar3,0);
  Am_Object::~Am_Object(&local_60);
  Am_Value_List::~Am_Value_List(&new_value);
  Am_Value_List::~Am_Value_List(&all_cmds);
  Am_Object::~Am_Object(&script_cmd);
  Am_Object::~Am_Object(&line);
  Am_Value_List::~Am_Value_List(&sel_cmds);
  Am_Object::~Am_Object(&execute_cmd);
  Am_Object::~Am_Object(&script_window);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_execute_script_step_one,
                 (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object execute_cmd = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Value_List sel_cmds =
      script_window.Get_Object(Am_UNDO_SCROLL_GROUP).Get(Am_VALUE);
  Am_Object line, script_cmd;
  if (sel_cmds.Valid()) {
    sel_cmds.Start();
    line = sel_cmds.Get();
    script_cmd = line.Get(Am_COMMAND);
  }
  do_execute_script(execute_cmd, true, script_cmd);
  Am_Value_List all_cmds =
      script_window.Get_Object(Am_UNDO_SCROLL_GROUP).Get(Am_ITEMS);
  all_cmds.Start();
  if (line.Valid()) {
    if (!all_cmds.Member(line))
      Am_ERROR("Line " << line << " lost from " << script_window);
  }
  //pointer is at line
  all_cmds.Next();
  Am_Value_List new_value;
  if (!all_cmds.Last()) { // otherwise, went past end, leave new_value null
    new_value.Add(all_cmds.Get());
  }
  if (am_sdebug)
    std::cout << "--One_step; Setting value of "
              << script_window.Get_Object(Am_UNDO_SCROLL_GROUP) << " to be "
              << new_value << std::endl
              << std::flush;
  script_window.Get_Object(Am_UNDO_SCROLL_GROUP).Set(Am_VALUE, new_value);
}